

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio_mem.cc
# Opt level: O1

int mem_write(BIO *bio,char *in,int inl)

{
  int iVar1;
  uint uVar2;
  
  BIO_clear_retry_flags(bio);
  if (inl < 1) {
    uVar2 = 0;
  }
  else if ((bio->flags & 0x200) == 0) {
    iVar1 = BUF_MEM_append((BUF_MEM *)bio->ptr,in,(ulong)(uint)inl);
    uVar2 = -(uint)(iVar1 == 0) | inl;
  }
  else {
    ERR_put_error(0x11,0,0x74,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio_mem.cc"
                  ,0x7e);
    uVar2 = 0xffffffff;
  }
  return uVar2;
}

Assistant:

static int mem_write(BIO *bio, const char *in, int inl) {
  BIO_clear_retry_flags(bio);
  if (inl <= 0) {
    return 0;  // Successfully write zero bytes.
  }

  if (bio->flags & BIO_FLAGS_MEM_RDONLY) {
    OPENSSL_PUT_ERROR(BIO, BIO_R_WRITE_TO_READ_ONLY_BIO);
    return -1;
  }

  BUF_MEM *b = reinterpret_cast<BUF_MEM *>(bio->ptr);
  if (!BUF_MEM_append(b, in, inl)) {
    return -1;
  }

  return inl;
}